

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O1

bool __thiscall
RealTrafficConnection::ProcessTrafficBuffer(RealTrafficConnection *this,JSON_Object *pBuf)

{
  double refPressure;
  _Alloc_hider _Var1;
  size_type sVar2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  JSON_Value *pJVar6;
  JSON_Array *array;
  long lVar7;
  char *pcVar8;
  char *pcVar9;
  mapped_type *this_00;
  size_t index;
  bool bVar10;
  double dVar11;
  initializer_list<unsigned_long> aIdx;
  initializer_list<unsigned_long> aIdx_00;
  initializer_list<unsigned_long> aIdx_01;
  unique_lock<std::mutex> mapFdLock;
  string s;
  FDKeyTy fdKey;
  FDDynamicData dyn;
  string acFilter;
  FDStaticData stat;
  positionTy posView;
  allocator<char> local_3a1;
  RealTrafficConnection *local_3a0;
  unique_lock<std::mutex> local_398;
  undefined8 local_388;
  JSON_Object *local_378;
  string local_370;
  positionTy local_350;
  FDKeyTy local_308;
  undefined8 local_2d8;
  double local_2d0;
  double local_2c8;
  size_t local_2c0;
  undefined1 local_2b8 [32];
  double local_298;
  double local_290;
  double local_288;
  double local_280;
  RealTrafficConnection *local_278;
  long *local_270;
  size_t local_268;
  long local_260 [2];
  string local_250;
  string local_230;
  undefined1 local_210 [64];
  _Alloc_hider local_1d0;
  char *local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  _Alloc_hider local_1b0;
  size_type local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  char *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  undefined8 local_150;
  int local_148;
  bool local_144;
  Doc8643 *local_140;
  _Alloc_hider local_138;
  char *local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  pointer local_118;
  pointer pbStack_110;
  pointer local_108;
  _Alloc_hider local_100;
  char *local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined2 local_80;
  positionTy local_78;
  
  if (pBuf != (JSON_Object *)0x0) {
    local_3a0 = this;
    DataRefs::GetDebugAcFilter_abi_cxx11_(&local_230,&dataRefs);
    DataRefs::GetViewPos();
    sVar5 = json_object_get_count(pBuf);
    if (sVar5 != 0) {
      local_2d8 = 0x2e6728;
      index = 0;
      local_378 = pBuf;
      local_2c0 = sVar5;
      while (iVar4 = (*(local_3a0->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                       _vptr_LTChannel[4])(), (char)iVar4 != '\0') {
        pJVar6 = json_object_get_value_at(pBuf,index);
        if (pJVar6 == (JSON_Value *)0x0) {
          bVar10 = true;
        }
        else {
          array = json_value_get_array(pJVar6);
          bVar10 = false;
          if (array != (JSON_Array *)0x0) {
            sVar5 = json_array_get_count(array);
            if (sVar5 < 0x30) {
              if ((int)dataRefs.iLogLevel < 3) {
                LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                       ,0x301,"ProcessTrafficBuffer",logWARN,
                       "Received too few fields in a/c record %ld",index);
              }
              (*(local_3a0->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[8])();
            }
            else {
              dVar11 = json_array_get_number(array,0x2f);
              lVar7 = lround(dVar11);
              pcVar8 = jag_s(array,0);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_250,pcVar8,(allocator<char> *)local_210);
              LTFlightData::FDKeyTy::FDKeyTy
                        (&local_308,(uint)(lVar7 != 0) * 2 + KEY_RT,&local_250,0x10);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p,
                                local_250.field_2._M_allocated_capacity + 1);
              }
              sVar2 = local_230._M_string_length;
              if (local_230._M_string_length == 0) {
LAB_00197c99:
                bVar10 = false;
              }
              else {
                local_270 = local_260;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_270,local_230._M_dataplus._M_p,
                           local_230._M_dataplus._M_p + local_230._M_string_length);
                bVar10 = true;
                if (local_308.key._M_string_length == local_268) {
                  if (local_308.key._M_string_length == 0) goto LAB_00197c99;
                  iVar4 = bcmp(local_308.key._M_dataplus._M_p,local_270,
                               local_308.key._M_string_length);
                  bVar10 = iVar4 != 0;
                }
              }
              if ((sVar2 != 0) && (local_270 != local_260)) {
                operator_delete(local_270,local_260[0] + 1);
              }
              pBuf = local_378;
              if (!bVar10) {
                LTFlightData::CheckDupKey
                          (&local_308,(uint)(local_308.eKeyType != KEY_ICAO) * 3 + KEY_FLARM);
                local_2c8 = json_array_get_number(array,10);
                local_2c8 = local_2c8 + local_3a0->tsAdjust;
                local_2d0 = json_array_get_number(array,1);
                local_350._lon = json_array_get_number(array,2);
                local_350._lat = local_2d0;
                local_350._alt = NAN;
                local_350._ts = local_2c8;
                local_350._head = NAN;
                local_350._pitch = NAN;
                local_350._roll = NAN;
                local_350.mergeCount = 1;
                local_350.f = (posFlagsTy)((ushort)local_350.f & 0x8000);
                local_350.edgeIdx = 0xffffffffffffffff;
                dVar11 = json_array_get_number(array,0xe);
                lVar7 = lround(dVar11);
                if (lVar7 == 0) {
                  local_350.f = (posFlagsTy)((ushort)local_350.f & 0xfcff | 0x100);
                  dVar11 = jag_n_nan(array,4);
                  if (NAN(dVar11)) {
                    dVar11 = json_array_get_number(array,0x12);
                  }
                  else {
                    refPressure = (local_3a0->rtWx).QNH;
                    if (!NAN(refPressure)) {
                      dVar11 = BaroAltToGeoAlt_m(dVar11 * 0.3048,refPressure);
                      dVar11 = dVar11 / 0.3048;
                    }
                  }
                  local_350._alt = dVar11 * 0.3048;
                }
                else {
                  local_350.f = (posFlagsTy)((ushort)local_350.f & 0xfcff | 0x200);
                }
                bVar10 = positionTy::isNormal(&local_350,true);
                _Var1._M_p = local_308.key._M_dataplus._M_p;
                pBuf = local_378;
                if (bVar10) {
                  local_210._0_8_ = local_210 + 0x10;
                  local_210._8_8_ = (char *)0x0;
                  local_210[0x10] = '\0';
                  local_210._32_8_ = local_210 + 0x30;
                  local_210._40_8_ = 0;
                  local_210[0x30] = '\0';
                  local_1d0._M_p = (pointer)&local_1c0;
                  local_1c8 = (char *)0x0;
                  local_1c0._M_local_buf[0] = '\0';
                  local_1b0._M_p = (pointer)&local_1a0;
                  local_1a8 = 0;
                  local_1a0._M_local_buf[0] = '\0';
                  local_190._M_p = (pointer)&local_180;
                  local_188 = 0;
                  local_180._M_local_buf[0] = '\0';
                  local_170._M_p = (pointer)&local_160;
                  local_168 = (char *)0x0;
                  local_160._M_local_buf[0] = '\0';
                  local_150._0_4_ = -1;
                  local_150._4_4_ = -1;
                  local_148 = 0;
                  local_144 = false;
                  local_140 = (Doc8643 *)0x0;
                  local_138._M_p = (pointer)&local_128;
                  local_130 = (char *)0x0;
                  local_128._M_local_buf[0] = '\0';
                  local_108 = (pointer)0x0;
                  local_118 = (pointer)0x0;
                  pbStack_110 = (pointer)0x0;
                  local_100._M_p = (pointer)&local_f0;
                  local_f8 = (char *)0x0;
                  local_f0._M_local_buf[0] = '\0';
                  local_e0._M_p = (pointer)&local_d0;
                  local_d8 = 0;
                  local_d0._M_local_buf[0] = '\0';
                  local_c0._M_p = (pointer)&local_b0;
                  local_b8 = 0;
                  local_b0._M_local_buf[0] = '\0';
                  local_a0._M_p = (pointer)&local_90;
                  local_98 = 0;
                  local_90._M_local_buf[0] = '\0';
                  local_80._0_1_ = false;
                  local_80._1_1_ = false;
                  pcVar9 = jag_s(array,8);
                  pcVar8 = local_1c8;
                  strlen(pcVar9);
                  std::__cxx11::string::_M_replace((ulong)&local_1d0,0,pcVar8,(ulong)pcVar9);
                  pcVar9 = jag_s(array,0xd);
                  pcVar8 = local_130;
                  strlen(pcVar9);
                  std::__cxx11::string::_M_replace((ulong)&local_138,0,pcVar8,(ulong)pcVar9);
                  pcVar8 = jag_s(array,9);
                  uVar3 = local_210._8_8_;
                  strlen(pcVar8);
                  std::__cxx11::string::_M_replace((ulong)local_210,0,(char *)uVar3,(ulong)pcVar8);
                  pcVar8 = jag_s(array,0xb);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_2b8,pcVar8,(allocator<char> *)&local_398);
                  pcVar8 = jag_s(array,0xc);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_370,pcVar8,&local_3a1);
                  LTFlightData::FDStaticData::setOrigDest
                            ((FDStaticData *)local_210,(string *)local_2b8,&local_370);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_370._M_dataplus._M_p != &local_370.field_2) {
                    operator_delete(local_370._M_dataplus._M_p,
                                    local_370.field_2._M_allocated_capacity + 1);
                  }
                  if ((undefined1 *)local_2b8._0_8_ != local_2b8 + 0x10) {
                    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
                  }
                  pcVar9 = jag_s(array,0x10);
                  pcVar8 = local_f8;
                  strlen(pcVar9);
                  std::__cxx11::string::_M_replace((ulong)&local_100,0,pcVar8,(ulong)pcVar9);
                  pcVar8 = jag_s(array,0x1c);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_370,pcVar8,(allocator<char> *)local_2b8);
                  pcVar9 = GetADSBEmitterCat(&local_370);
                  pcVar8 = local_168;
                  strlen(pcVar9);
                  std::__cxx11::string::_M_replace((ulong)&local_170,0,pcVar8,(ulong)pcVar9);
                  iVar4 = std::__cxx11::string::compare((char *)&local_1d0);
                  if (iVar4 == 0) {
                    std::__cxx11::string::_M_replace((ulong)&local_1d0,0,local_1c8,0x278585);
                  }
                  iVar4 = std::__cxx11::string::compare((char *)&local_370);
                  if ((((iVar4 == 0) ||
                       (iVar4 = std::__cxx11::string::compare((char *)&local_370), iVar4 == 0)) ||
                      (iVar4 = std::__cxx11::string::compare((char *)&local_370), iVar4 == 0)) ||
                     ((iVar4 = std::__cxx11::string::compare(local_210), iVar4 == 0 &&
                      (iVar4 = std::__cxx11::string::compare((char *)&local_1d0), iVar4 == 0)))) {
                    std::__cxx11::string::_M_replace((ulong)&local_1d0,0,local_1c8,0x24ec93);
                    std::__cxx11::string::_M_assign((string *)local_210);
                  }
                  iVar4 = std::__cxx11::string::compare((char *)&local_1d0);
                  if ((((iVar4 == 0) ||
                       (iVar4 = std::__cxx11::string::compare((char *)&local_1d0), iVar4 == 0)) ||
                      ((iVar4 = std::__cxx11::string::compare((char *)&local_370), iVar4 == 0 ||
                       (iVar4 = std::__cxx11::string::compare((char *)&local_370), iVar4 == 0)))) ||
                     ((((local_370._M_string_length == 0 && (((ushort)local_350.f & 0x300) == 0x200)
                        ) && (local_1c8 == (char *)0x0)) && ((char *)local_210._8_8_ == (char *)0x0)
                      ))) {
                    std::__cxx11::string::_M_assign((string *)&local_1d0);
                  }
                  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)local_2b8);
                  pBuf = local_378;
                  dVar11 = jag_sn(array,6);
                  local_2b8._8_8_ = lround(dVar11);
                  local_2b8[0x18] = ((ushort)local_350.f & 0x300) == 0x200;
                  local_398._M_device = (mutex_type *)0x19;
                  local_398._M_owns = true;
                  local_398._9_7_ = 0;
                  local_388 = 0x18;
                  aIdx._M_len = 3;
                  aIdx._M_array = (iterator)&local_398;
                  pJVar6 = jag_FindFirstNonNull(array,aIdx);
                  dVar11 = NAN;
                  if (pJVar6 != (JSON_Value *)0x0) {
                    dVar11 = json_value_get_number(pJVar6);
                  }
                  local_398._M_device = (mutex_type *)0x5;
                  local_398._M_owns = true;
                  local_398._9_7_ = 0;
                  local_388 = 0x13;
                  aIdx_00._M_len = 3;
                  aIdx_00._M_array = (iterator)&local_398;
                  local_350._head = dVar11;
                  local_298 = dVar11;
                  pJVar6 = jag_FindFirstNonNull(array,aIdx_00);
                  if (pJVar6 == (JSON_Value *)0x0) {
                    local_290 = 0.0;
                  }
                  else {
                    local_290 = json_value_get_number(pJVar6);
                  }
                  local_398._M_device = (mutex_type *)0xf;
                  local_398._8_8_ = 0x1a;
                  aIdx_01._M_len = 2;
                  aIdx_01._M_array = (iterator)&local_398;
                  pJVar6 = jag_FindFirstNonNull(array,aIdx_01);
                  if (pJVar6 == (JSON_Value *)0x0) {
                    local_288 = 0.0;
                  }
                  else {
                    local_288 = json_value_get_number(pJVar6);
                  }
                  local_280 = local_350._ts;
                  local_278 = local_3a0;
                  local_398._M_device = &mapFdMutex;
                  local_398._8_8_ = local_398._8_8_ & 0xffffffffffffff00;
                  std::unique_lock<std::mutex>::lock(&local_398);
                  local_398._M_owns = true;
                  this_00 = std::
                            map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                            ::operator[](&mapFd,&local_308);
                  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this_00->dataAccessMutex);
                  if (iVar4 != 0) {
                    std::__throw_system_error(iVar4);
                  }
                  std::unique_lock<std::mutex>::unlock(&local_398);
                  if ((this_00->acKey).key._M_string_length == 0) {
                    LTFlightData::SetKey(this_00,&local_308);
                  }
                  dVar11 = CoordDistance(&local_350,&local_78);
                  LTFlightData::UpdateData(this_00,(FDStaticData *)local_210,dVar11,DATREQU_NONE);
                  LTFlightData::AddDynData(this_00,(FDDynamicData *)local_2b8,0,0,&local_350);
                  pthread_mutex_unlock((pthread_mutex_t *)&this_00->dataAccessMutex);
                  std::unique_lock<std::mutex>::~unique_lock(&local_398);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_370._M_dataplus._M_p != &local_370.field_2) {
                    operator_delete(local_370._M_dataplus._M_p,
                                    local_370.field_2._M_allocated_capacity + 1);
                  }
                  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)local_210);
                }
                else if ((int)dataRefs.iLogLevel < 1) {
                  positionTy::dbgTxt_abi_cxx11_((string *)local_210,&local_350);
                  LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTRealTraffic.cpp"
                         ,0x32f,"ProcessTrafficBuffer",logDEBUG,"A/c %s reached invalid pos: %s",
                         _Var1._M_p,local_210._0_8_);
                  if ((undefined1 *)local_210._0_8_ != local_210 + 0x10) {
                    operator_delete((void *)local_210._0_8_,
                                    CONCAT71(local_210._17_7_,local_210[0x10]) + 1);
                  }
                }
              }
              bVar10 = false;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_308.key._M_dataplus._M_p != &local_308.key.field_2) {
                operator_delete(local_308.key._M_dataplus._M_p,
                                local_308.key.field_2._M_allocated_capacity + 1);
              }
            }
          }
        }
        if ((bVar10) || (index = index + 1, local_2c0 == index)) break;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
  }
  return pBuf != (JSON_Object *)0x0;
}

Assistant:

bool RealTrafficConnection::ProcessTrafficBuffer (const JSON_Object* pBuf)
{
    // Quick exit if no data
    if (!pBuf) return false;
    
    // any a/c filter defined for debugging purposes?
    const std::string acFilter ( dataRefs.GetDebugAcFilter() );
    
    // Current camera position
    const positionTy posView = dataRefs.GetViewPos();
    
    // The data is delivered in many many values,
    // ie. each plane is just a JSON_Value, its name being the hexid,
    // its value being an array with the details.
    // That means we need to traverse all values, not knowing which are in there.
    // Most are planes, but some are just ordinary values like "status" or "rll"...
    // Really bad data structure design if you'd ask me...
    //   {
    //     "a1bc56": ["a1bc56",34.21124,-118.939533, ...],
    //     "a1ef41": ["a1ef41",34.263657,-118.863373, ...],
    //     ...
    //     "a26738": ["a26738",33.671356,-117.867284, ...],
    //     "full_count": 13501, "source": "MemoryDB", "rrl": 2000, "status": 200, "dataepoch": 1703885732
    //   }
    const size_t numVals = json_object_get_count(pBuf);
    for (size_t i = 0; i < numVals && shallRun(); ++i)
    {
        // Get the array 'behind' the i-th value,
        // will fail if it is no aircraft entry
        const JSON_Value* pVal = json_object_get_value_at(pBuf, i);
        if (!pVal) break;
        const JSON_Array* pJAc = json_value_get_array(pVal);
        if (!pJAc) continue;                  // probably not an aircraft line
        
        // Check for minimum number of fields
        if (json_array_get_count(pJAc) < RT_DRCT_NUM_FIELDS) {
            LOG_MSG(logWARN, "Received too few fields in a/c record %ld", (long)i);
            IncErrCnt();
            continue;
        }
        
        // the key: transponder Icao code
        bool b = jag_l(pJAc, RT_DRCT_ICAO_ID) != 0;   // is an ICAO id?
        LTFlightData::FDKeyTy fdKey (b ? LTFlightData::KEY_ICAO : LTFlightData::KEY_RT,
                                     jag_s(pJAc, RT_DRCT_HexId));
        // not matching a/c filter? -> skip it
        if ((!acFilter.empty() && (fdKey != acFilter)) )
            continue;

        // Check for duplicates with OGN/FLARM, potentially replaces the key type
        if (fdKey.eKeyType == LTFlightData::KEY_ICAO)
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_FLARM);
        else
            // Some codes are otherwise often duplicate with ADSBEx
            LTFlightData::CheckDupKey(fdKey, LTFlightData::KEY_ADSBEX);
        
        // position time
        double posTime = jag_n(pJAc, RT_DRCT_TimeStamp);
        //  (needs adjustment in case we are receiving historical data)
        posTime += tsAdjust;
        
        // position
        positionTy pos (jag_n(pJAc, RT_DRCT_Lat),
                        jag_n(pJAc, RT_DRCT_Lon),
                        NAN,                            // we take care of altitude next
                        posTime);
        if (jag_l(pJAc, RT_DRCT_Gnd) != 0)              // on ground?
            pos.f.onGrnd = GND_ON;
        else {
            pos.f.onGrnd = GND_OFF;
            double d = jag_n_nan(pJAc, RT_DRCT_BaroAlt);    // prefer baro altitude
            if (!std::isnan(d)) {
                if (!std::isnan(rtWx.QNH))
                    d = BaroAltToGeoAlt_ft(d, rtWx.QNH);
                pos.SetAltFt(d);
            }
            else                                        // else try geo altitude
                pos.SetAltFt(jag_n(pJAc, RT_DRCT_GeoAlt));
        }
        // position is rather important, we check for validity
        // (we do allow alt=NAN if on ground)
        if ( !pos.isNormal(true) ) {
            LOG_MSG(logDEBUG,ERR_POS_UNNORMAL,fdKey.c_str(),pos.dbgTxt().c_str());
            continue;
        }
        
        // Static data
        LTFlightData::FDStaticData stat;
        stat.acTypeIcao         = jag_s(pJAc, RT_DRCT_AcType);
        stat.call               = jag_s(pJAc, RT_DRCT_CallSign);
        stat.reg                = jag_s(pJAc, RT_DRCT_Reg);
        stat.setOrigDest(         jag_s(pJAc, RT_DRCT_Origin),
                                  jag_s(pJAc, RT_DRCT_Dest)  );
        stat.flight             = jag_s(pJAc, RT_DRCT_FlightNum);
        
        std::string s           = jag_s(pJAc, RT_DRCT_Category);
        stat.catDescr           = GetADSBEmitterCat(s);
        
        // RealTraffic often sends ASW20 when it should be AS20, a glider
        if (stat.acTypeIcao == "ASW20") stat.acTypeIcao = "AS20";
        
        // Static objects are all equally marked with a/c type TWR
        if ((s == "C3" || s == "C4" || s == "C5") ||
            (stat.reg == STATIC_OBJECT_TYPE && stat.acTypeIcao == STATIC_OBJECT_TYPE))
        {
            stat.reg = stat.acTypeIcao = STATIC_OBJECT_TYPE;
        }

        // Vehicle?
        if (stat.acTypeIcao == "GRND" || stat.acTypeIcao == "GND" ||// some vehicles come with type 'GRND'...
            s == "C1" || s == "C2" ||                               // emergency/surface vehicle?
            (s.empty() && (pos.f.onGrnd == GND_ON) && stat.acTypeIcao.empty() && stat.reg.empty()))
            stat.acTypeIcao = dataRefs.GetDefaultCarIcaoType();

        // Dynamic data
        LTFlightData::FDDynamicData dyn;
        dyn.radar.code          = std::lround(jag_sn(pJAc, RT_DRCT_Squawk));
        dyn.gnd                 = pos.f.onGrnd == GND_ON;
        // Heading: try in this order: True Heading, Track, Magnetic heading
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_HeadTrue,
                                                         RT_DRCT_Track,
                                                         RT_DRCT_HeadMag });
        pos.heading() = dyn.heading = pVal ? json_value_get_number(pVal) : NAN;
        // Speed: try in this order: ground speed, TAS, IAS, 0.0
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_GndSpeed,
                                                         RT_DRCT_TAS,
                                                         RT_DRCT_IAS });
        dyn.spd = pVal ? json_value_get_number(pVal) : 0.0;
        // VSI: try in this order barometric and geometric vertical speed
        pVal                    = jag_FindFirstNonNull(pJAc,
                                                       { RT_DRCT_BaroVertRate,
                                                         RT_DRCT_GeoVertRate });
        dyn.vsi = pVal ? json_value_get_number(pVal) : 0.0;
        
        dyn.ts = pos.ts();
        dyn.pChannel = this;
        
        try {
            // from here on access to fdMap guarded by a mutex
            // until FD object is inserted and updated
            std::unique_lock<std::mutex> mapFdLock (mapFdMutex);

            // get the fd object from the map, key is the transpIcao
            // this fetches an existing or, if not existing, creates a new one
            LTFlightData& fd = mapFd[fdKey];
            
            // also get the data access lock once and for all
            // so following fetch/update calls only make quick recursive calls
            std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
            // now that we have the detail lock we can release the global one
            mapFdLock.unlock();

            // completely new? fill key fields
            if ( fd.empty() )
                fd.SetKey(fdKey);
            
            // add the static data
            fd.UpdateData(std::move(stat), pos.dist(posView));

            // add the dynamic data
            fd.AddDynData(dyn, 0, 0, &pos);

        } catch(const std::system_error& e) {
            LOG_MSG(logERR, ERR_LOCK_ERROR, "mapFd", e.what());
            IncErrCnt();
        }
    }
    
    return true;
}